

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

lysc_node_notif * lysc_node_notifs(lysc_node *node)

{
  lysc_node_notif **pplVar1;
  lysc_node_notif *plVar2;
  
  pplVar1 = lysc_node_notifs_p(node);
  if (pplVar1 == (lysc_node_notif **)0x0) {
    plVar2 = (lysc_node_notif *)0x0;
  }
  else {
    plVar2 = *pplVar1;
  }
  return plVar2;
}

Assistant:

lysc_node_notif *
lysc_node_notifs(const struct lysc_node *node)
{
    struct lysc_node_notif **notifs;

    notifs = lysc_node_notifs_p((struct lysc_node *)node);
    if (notifs) {
        return *notifs;
    } else {
        return NULL;
    }
}